

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void scqf(int nt,double *t,int *mlt,double *wts,int param_5,int *ndx,double *swts,double *st,
         int kind,double alpha,double beta,double a,double b)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_38;
  int iVar4;
  
  dVar8 = r8_epsilon();
  parchk(kind,1,alpha,beta);
  dVar10 = 0.0;
  local_38 = a;
  switch(kind) {
  case 1:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      local_38 = (a + b) * 0.5;
      dVar10 = (b - a) * 0.5;
      dVar8 = 0.0;
      alpha = 0.0;
      goto LAB_001d241e;
    }
    break;
  case 2:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      alpha = -0.5;
LAB_001d23ef:
      local_38 = (a + b) * 0.5;
      dVar10 = (b - a) * 0.5;
      dVar8 = alpha;
      goto LAB_001d241e;
    }
    break;
  case 3:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      local_38 = (a + b) * 0.5;
      dVar10 = (b - a) * 0.5;
      dVar8 = alpha;
      goto LAB_001d241e;
    }
    break;
  case 4:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      local_38 = (a + b) * 0.5;
      dVar10 = (b - a) * 0.5;
      dVar8 = beta;
      goto LAB_001d241e;
    }
    break;
  case 5:
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  B <= 0\n";
      goto LAB_001d24ff;
    }
    dVar10 = 1.0 / b;
    goto LAB_001d2419;
  case 6:
    if (b <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  B <= 0.\n";
      goto LAB_001d24ff;
    }
    if (b < 0.0) {
      dVar10 = sqrt(b);
    }
    else {
      dVar10 = SQRT(b);
    }
    dVar10 = 1.0 / dVar10;
LAB_001d2419:
    dVar8 = 0.0;
LAB_001d241e:
    dVar8 = pow(dVar10,dVar8 + alpha + 1.0);
    uVar2 = 0;
    uVar7 = (ulong)(uint)nt;
    if (nt < 1) {
      uVar7 = uVar2;
    }
    for (; uVar2 != uVar7; uVar2 = uVar2 + 1) {
      st[uVar2] = t[uVar2] * dVar10 + local_38;
      iVar1 = ndx[uVar2];
      if (iVar1 != 0) {
        iVar4 = -iVar1;
        if (0 < iVar1) {
          iVar4 = iVar1;
        }
        uVar3 = iVar4 - 1;
        iVar1 = mlt[uVar2];
        dVar9 = dVar8;
        for (lVar6 = 0; (int)(uVar3 + (int)lVar6) < (int)(iVar1 + uVar3); lVar6 = lVar6 + 1) {
          swts[(ulong)uVar3 + lVar6] = dVar9 * wts[(ulong)uVar3 + lVar6];
          dVar9 = dVar10 * dVar9;
        }
      }
    }
    return;
  case 7:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      local_38 = (a + b) * 0.5;
      dVar10 = (b - a) * 0.5;
      goto LAB_001d2419;
    }
    break;
  case 8:
    dVar10 = b + a;
    dVar8 = beta;
    if (dVar10 <= 0.0) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
      pcVar5 = "  A + B <= 0.\n";
      goto LAB_001d24ff;
    }
    goto LAB_001d241e;
  case 9:
    dVar10 = r8_abs(b - a);
    if (dVar8 < dVar10) {
      alpha = 0.5;
      goto LAB_001d23ef;
    }
    break;
  default:
    alpha = 0.0;
    local_38 = 0.0;
    dVar8 = 0.0;
    goto LAB_001d241e;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"SCQF - Fatal error!\n");
  pcVar5 = "  |B - A| too small.\n";
LAB_001d24ff:
  std::operator<<((ostream *)&std::cerr,pcVar5);
  exit(1);
}

Assistant:

void scqf ( int nt, double t[], int mlt[], double wts[], int /*nwts*/, int ndx[], 
  double swts[], double st[], int kind, double alpha, double beta, double a, 
  double b )

//****************************************************************************80
//
//  Purpose:
//
//    SCQF scales a quadrature formula to a nonstandard interval.
//
//  Discussion:
//
//    The arrays WTS and SWTS may coincide.
//
//    The arrays T and ST may coincide.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    16 February 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int NT, the number of knots.
//
//    Input, double T[NT], the original knots.
//
//    Input, int MLT[NT], the multiplicity of the knots.
//
//    Input, double WTS[NWTS], the weights.
//
//    Input, int NWTS, the number of weights.
//
//    Input, int NDX[NT], used to index the array WTS.  
//    For more details see the comments in CAWIQ.
//
//    Output, double SWTS[NWTS], the scaled weights.
//
//    Output, double ST[NT], the scaled knots.
//
//    Input, int KIND, the rule.
//    1, Legendre,             (a,b)       1.0
//    2, Chebyshev Type 1,     (a,b)       ((b-x)*(x-a))^(-0.5)
//    3, Gegenbauer,           (a,b)       ((b-x)*(x-a))^alpha
//    4, Jacobi,               (a,b)       (b-x)^alpha*(x-a)^beta
//    5, Generalized Laguerre, (a,+oo)     (x-a)^alpha*exp(-b*(x-a))
//    6, Generalized Hermite,  (-oo,+oo)   |x-a|^alpha*exp(-b*(x-a)^2)
//    7, Exponential,          (a,b)       |x-(a+b)/2.0|^alpha
//    8, Rational,             (a,+oo)     (x-a)^alpha*(x+b)^beta
//    9, Chebyshev Type 2,     (a,b)       ((b-x)*(x-a))^(+0.5)
//
//    Input, double ALPHA, the value of Alpha, if needed.
//
//    Input, double BETA, the value of Beta, if needed.
//
//    Input, double A, B, the interval endpoints.
//
{
  double al = 0.0; // Silence uninitialized warning.
  double be = 0.0; // Silence uninitialized warning.
  int i;
  int k;
  int l;
  double p;
  double shft = 0.0; // Silence uninitialized warning.
  double slp = 0.0; // Silence uninitialized warning.
  double temp;
  double tmp;

  temp = r8_epsilon ( );

  parchk ( kind, 1, alpha, beta );

  if ( kind == 1 )
  {
    al = 0.0;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 2 )
  {
    al = -0.5;
    be = -0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 3 )
  {
    al = alpha;
    be = alpha;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 4 )
  {
    al = alpha;
    be = beta;

    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 5 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / b;
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 6 )
  {
    if ( b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = 1.0 / sqrt ( b );
    al = alpha;
    be = 0.0;
  }
  else if ( kind == 7 )
  {
    al = alpha;
    be = 0.0;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }
  else if ( kind == 8 )
  {
    if ( a + b <= 0.0 )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  A + B <= 0.\n";
      exit ( 1 );
    }
    shft = a;
    slp = a + b;
    al = alpha;
    be = beta;
  }
  else if ( kind == 9 )
  {
    al = 0.5;
    be = 0.5;
    if ( r8_abs ( b - a ) <= temp )
    {
      std::cerr << "\n";
      std::cerr << "SCQF - Fatal error!\n";
      std::cerr << "  |B - A| too small.\n";
      exit ( 1 );
    }
    shft = ( a + b ) / 2.0;
    slp = ( b - a ) / 2.0;
  }

  p = pow ( slp, al + be + 1.0 );

  for ( k = 0; k < nt; k++ )
  {
    st[k] = shft + slp * t[k];
    l = abs ( ndx[k] );

    if ( l != 0 )
    {
      tmp = p;
      for ( i = l - 1; i <= l - 1 + mlt[k] - 1; i++ )
      {
        swts[i] = wts[i] * tmp;
        tmp = tmp * slp;
      }
    }
  }
  return;
}